

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack1to4.h
# Opt level: O3

void ncnn::conv3x3s2_pack1to4_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  void **ppvVar1;
  undefined4 *puVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  uint uVar28;
  uint uVar29;
  int iVar30;
  int iVar31;
  float fVar32;
  float fVar39;
  float fVar40;
  float fVar44;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined1 (*pauVar66) [16];
  int iVar67;
  uint uVar68;
  uint uVar69;
  ulong uVar70;
  ulong uVar71;
  undefined4 *puVar72;
  undefined4 *puVar73;
  long lVar74;
  undefined4 *puVar75;
  long lVar76;
  undefined1 (*pauVar77) [16];
  float *pfVar78;
  undefined1 (*pauVar79) [16];
  void *pvVar80;
  ulong uVar81;
  int iVar82;
  undefined1 (*pauVar83) [16];
  float *pfVar84;
  ulong uVar85;
  float *pfVar86;
  ulong uVar87;
  void *pvVar88;
  float *pfVar89;
  void *pvVar90;
  long lVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined4 uVar97;
  undefined4 uVar98;
  undefined4 uVar99;
  undefined4 uVar100;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  ulong local_148;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined8 *local_98;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  
  uVar28 = bottom_blob->c;
  uVar29 = top_blob->w;
  iVar30 = top_blob->h;
  iVar31 = top_blob->c;
  uVar81 = (long)iVar31 & 0xfffffffffffffffe;
  lVar91 = (long)(int)(((bottom_blob->w - uVar29) - uVar29) + bottom_blob->w);
  if (0 < iVar31 >> 1) {
    uVar87 = 0;
    do {
      uVar70 = (long)top_blob->h * (long)top_blob->w;
      uVar71 = top_blob->elemsize;
      lVar76 = top_blob->cstep * uVar71;
      if (top_blob->dims != 4) {
        uVar70 = (uVar70 * uVar71 + 0xf & 0xfffffffffffffff0) / uVar71;
      }
      uVar71 = uVar87 * 2;
      uVar85 = uVar71 | 1;
      if (_bias == (Mat *)0x0) {
        uVar97 = 0;
        uVar98 = 0;
        uVar99 = 0;
        uVar100 = 0;
        auVar92 = ZEXT816(0) << 0x40;
      }
      else {
        ppvVar1 = &_bias->data + uVar87 * 4;
        uVar97 = *(undefined4 *)ppvVar1;
        uVar98 = *(undefined4 *)((long)ppvVar1 + 4);
        uVar99 = *(undefined4 *)(ppvVar1 + 1);
        uVar100 = *(undefined4 *)((long)ppvVar1 + 0xc);
        auVar92 = *(undefined1 (*) [16])(&_bias->data + uVar85 * 2);
      }
      puVar72 = (undefined4 *)(lVar76 * uVar71 + (long)top_blob->data);
      pauVar77 = (undefined1 (*) [16])(lVar76 * uVar85 + (long)top_blob->data);
      iVar82 = top_blob->d * (int)uVar70;
      puVar75 = puVar72;
      iVar67 = iVar82;
      if (0 < iVar82) {
        do {
          *puVar75 = uVar97;
          puVar75[1] = uVar98;
          puVar75[2] = uVar99;
          puVar75[3] = uVar100;
          iVar67 = iVar67 + -1;
          puVar75 = puVar75 + 4;
        } while (iVar67 != 0);
        pauVar83 = pauVar77;
        if (0 < iVar82) {
          do {
            *pauVar83 = auVar92;
            iVar82 = iVar82 + -1;
            pauVar83 = pauVar83 + 1;
          } while (iVar82 != 0);
        }
      }
      if (0 < (int)uVar28) {
        pfVar86 = (float *)(uVar85 * kernel->elemsize * kernel->cstep + (long)kernel->data);
        local_98 = (undefined8 *)(uVar71 * kernel->cstep * kernel->elemsize + (long)kernel->data);
        local_148 = 0;
        do {
          if (0 < iVar30) {
            uVar62 = *local_98;
            uVar63 = local_98[1];
            auVar92 = *(undefined1 (*) [16])(local_98 + 2);
            auVar21 = *(undefined1 (*) [16])(local_98 + 4);
            auVar22 = *(undefined1 (*) [16])(local_98 + 6);
            auVar23 = *(undefined1 (*) [16])(local_98 + 8);
            auVar24 = *(undefined1 (*) [16])(local_98 + 10);
            auVar25 = *(undefined1 (*) [16])(local_98 + 0xc);
            auVar26 = *(undefined1 (*) [16])(local_98 + 0xe);
            auVar93 = *(undefined1 (*) [16])(local_98 + 0x10);
            fVar58 = *pfVar86;
            fVar59 = pfVar86[1];
            fVar60 = pfVar86[2];
            fVar61 = pfVar86[3];
            fVar38 = pfVar86[4];
            fVar37 = pfVar86[5];
            fVar36 = pfVar86[6];
            fVar35 = pfVar86[7];
            fVar54 = pfVar86[8];
            fVar55 = pfVar86[9];
            fVar56 = pfVar86[10];
            fVar57 = pfVar86[0xb];
            auVar94 = *(undefined1 (*) [16])(pfVar86 + 0xc);
            auVar107 = ZEXT1664(auVar94);
            fVar34 = pfVar86[0x10];
            fVar33 = pfVar86[0x11];
            fVar32 = pfVar86[0x12];
            fVar39 = pfVar86[0x13];
            auVar95 = *(undefined1 (*) [16])(pfVar86 + 0x14);
            auVar96 = *(undefined1 (*) [16])(pfVar86 + 0x18);
            pvVar90 = (void *)(bottom_blob->cstep * local_148 * bottom_blob->elemsize +
                              (long)bottom_blob->data);
            lVar76 = (long)bottom_blob->w * bottom_blob->elemsize;
            pvVar80 = (void *)((long)pvVar90 + lVar76 * 2);
            pvVar88 = (void *)(lVar76 + (long)pvVar90);
            iVar67 = 0;
            uVar64 = *(undefined8 *)(pfVar86 + 0x1c);
            uVar65 = *(undefined8 *)(pfVar86 + 0x1e);
            auVar27 = *(undefined1 (*) [16])(pfVar86 + 0x20);
            puVar75 = puVar72;
            pauVar83 = pauVar77;
            do {
              local_228 = (float)uVar62;
              fStack_220 = (float)uVar63;
              local_198 = auVar92._0_4_;
              fStack_190 = auVar92._8_4_;
              fStack_18c = auVar92._12_4_;
              local_188 = auVar21._0_4_;
              fStack_180 = auVar21._8_4_;
              fStack_17c = auVar21._12_4_;
              local_1a8 = auVar22._0_4_;
              fStack_1a0 = auVar22._8_4_;
              fStack_19c = auVar22._12_4_;
              local_f8 = auVar23._0_4_;
              fStack_f4 = auVar23._4_4_;
              fStack_f0 = auVar23._8_4_;
              fStack_ec = auVar23._12_4_;
              local_1c8 = auVar24._0_4_;
              fStack_1c0 = auVar24._8_4_;
              fStack_1bc = auVar24._12_4_;
              local_1b8 = auVar25._0_4_;
              fStack_1b0 = auVar25._8_4_;
              fStack_1ac = auVar25._12_4_;
              local_108 = auVar26._0_4_;
              fStack_104 = auVar26._4_4_;
              fStack_100 = auVar26._8_4_;
              fStack_fc = auVar26._12_4_;
              local_138 = auVar94._0_4_;
              fStack_134 = auVar94._4_4_;
              fStack_130 = auVar94._8_4_;
              fStack_12c = auVar94._12_4_;
              local_e8 = auVar93._0_4_;
              fStack_e4 = auVar93._4_4_;
              fStack_e0 = auVar93._8_4_;
              fStack_dc = auVar93._12_4_;
              local_208 = auVar95._0_4_;
              fStack_200 = auVar95._8_4_;
              fStack_1fc = auVar95._12_4_;
              local_118 = auVar96._0_4_;
              fStack_114 = auVar96._4_4_;
              fStack_110 = auVar96._8_4_;
              fStack_10c = auVar96._12_4_;
              local_168 = (float)uVar64;
              fStack_160 = (float)uVar65;
              local_178 = auVar27._0_4_;
              fStack_170 = auVar27._8_4_;
              fStack_16c = auVar27._12_4_;
              fStack_224 = (float)((ulong)uVar62 >> 0x20);
              fStack_21c = (float)((ulong)uVar63 >> 0x20);
              fStack_194 = auVar92._4_4_;
              fStack_184 = auVar21._4_4_;
              fStack_1a4 = auVar22._4_4_;
              fStack_1c4 = auVar24._4_4_;
              fStack_1b4 = auVar25._4_4_;
              fStack_204 = auVar95._4_4_;
              fStack_164 = (float)((ulong)uVar64 >> 0x20);
              fStack_15c = (float)((ulong)uVar65 >> 0x20);
              fStack_174 = auVar27._4_4_;
              if ((int)uVar29 < 4) {
                uVar69 = 0;
              }
              else {
                iVar82 = 3;
                lVar76 = 0;
                puVar2 = puVar75;
                pauVar66 = pauVar83;
                do {
                  pauVar79 = pauVar66;
                  puVar73 = puVar2;
                  fVar3 = *(float *)((long)pvVar90 + lVar76);
                  fVar4 = *(float *)((long)pvVar90 + lVar76 + 4);
                  fVar5 = *(float *)((long)pvVar90 + lVar76 + 8);
                  fVar6 = *(float *)((long)pvVar88 + lVar76);
                  fVar7 = *(float *)((long)pvVar88 + lVar76 + 4);
                  fVar8 = *(float *)((long)pvVar88 + lVar76 + 8);
                  fVar9 = *(float *)((long)pvVar80 + lVar76);
                  fVar10 = *(float *)((long)pvVar80 + lVar76 + 4);
                  puVar2 = (undefined4 *)((long)puVar75 + lVar76 * 2 + 0x40);
                  fVar11 = *(float *)((long)pvVar80 + lVar76 + 8);
                  pauVar66 = (undefined1 (*) [16])(pauVar83[4] + lVar76 * 2);
                  fVar43 = *(float *)pauVar66[-4];
                  fVar42 = *(float *)(pauVar66[-4] + 4);
                  fVar41 = *(float *)(pauVar66[-4] + 8);
                  fVar40 = *(float *)(pauVar66[-4] + 0xc);
                  puVar2[-0x10] =
                       fVar4 * local_198 + fVar5 * local_188 + fVar6 * local_1a8 + fVar8 * local_1c8
                       + fVar10 * local_108 +
                       fVar3 * local_228 + (float)puVar2[-0x10] + fVar7 * local_f8 +
                       fVar9 * local_1b8 + fVar11 * local_e8;
                  puVar2[-0xf] = fVar4 * fStack_194 + fVar5 * fStack_184 + fVar6 * fStack_1a4 +
                                 fVar8 * fStack_1c4 + fVar10 * fStack_104 +
                                 fVar3 * fStack_224 + (float)puVar2[-0xf] + fVar7 * fStack_f4 +
                                 fVar9 * fStack_1b4 + fVar11 * fStack_e4;
                  puVar2[-0xe] = fVar4 * fStack_190 + fVar5 * fStack_180 + fVar6 * fStack_1a0 +
                                 fVar8 * fStack_1c0 + fVar10 * fStack_100 +
                                 fVar3 * fStack_220 + (float)puVar2[-0xe] + fVar7 * fStack_f0 +
                                 fVar9 * fStack_1b0 + fVar11 * fStack_e0;
                  puVar2[-0xd] = fVar4 * fStack_18c + fVar5 * fStack_17c + fVar6 * fStack_19c +
                                 fVar8 * fStack_1bc + fVar10 * fStack_fc +
                                 fVar3 * fStack_21c + (float)puVar2[-0xd] + fVar7 * fStack_ec +
                                 fVar9 * fStack_1ac + fVar11 * fStack_dc;
                  *(float *)pauVar66[-4] =
                       fVar11 * local_178 +
                       fVar7 * fVar34 + fVar3 * fVar58 + fVar43 + fVar9 * local_118 +
                       fVar4 * fVar38 + fVar5 * fVar54 + fVar6 * local_138 + fVar8 * local_208 +
                       fVar10 * local_168;
                  *(float *)(pauVar66[-4] + 4) =
                       fVar11 * fStack_174 +
                       fVar7 * fVar33 + fVar3 * fVar59 + fVar42 + fVar9 * fStack_114 +
                       fVar4 * fVar37 + fVar5 * fVar55 + fVar6 * fStack_134 + fVar8 * fStack_204 +
                       fVar10 * fStack_164;
                  *(float *)(pauVar66[-4] + 8) =
                       fVar11 * fStack_170 +
                       fVar7 * fVar32 + fVar3 * fVar60 + fVar41 + fVar9 * fStack_110 +
                       fVar4 * fVar36 + fVar5 * fVar56 + fVar6 * fStack_130 + fVar8 * fStack_200 +
                       fVar10 * fStack_160;
                  *(float *)(pauVar66[-4] + 0xc) =
                       fVar11 * fStack_16c +
                       fVar7 * fVar39 + fVar3 * fVar61 + fVar40 + fVar9 * fStack_10c +
                       fVar4 * fVar35 + fVar5 * fVar57 + fVar6 * fStack_12c + fVar8 * fStack_1fc +
                       fVar10 * fStack_15c;
                  fVar3 = *(float *)((long)pvVar90 + lVar76 + 0xc);
                  fVar4 = *(float *)((long)pvVar88 + lVar76 + 0xc);
                  fVar6 = *(float *)((long)pvVar80 + lVar76 + 0xc);
                  fVar7 = *(float *)((long)pvVar90 + lVar76 + 0x10);
                  fVar9 = *(float *)((long)pvVar88 + lVar76 + 0x10);
                  fVar10 = *(float *)((long)pvVar80 + lVar76 + 0x10);
                  fVar43 = *(float *)pauVar66[-3];
                  fVar42 = *(float *)(pauVar66[-3] + 4);
                  fVar41 = *(float *)(pauVar66[-3] + 8);
                  fVar40 = *(float *)(pauVar66[-3] + 0xc);
                  puVar2[-0xc] = fVar7 * local_188 + fVar9 * local_1c8 + fVar10 * local_e8 +
                                 fVar8 * local_1a8 + fVar5 * local_228 + (float)puVar2[-0xc] +
                                 fVar11 * local_1b8 + fVar3 * local_198 + fVar4 * local_f8 +
                                 fVar6 * local_108;
                  puVar2[-0xb] = fVar7 * fStack_184 + fVar9 * fStack_1c4 + fVar10 * fStack_e4 +
                                 fVar8 * fStack_1a4 + fVar5 * fStack_224 + (float)puVar2[-0xb] +
                                 fVar11 * fStack_1b4 + fVar3 * fStack_194 + fVar4 * fStack_f4 +
                                 fVar6 * fStack_104;
                  puVar2[-10] = fVar7 * fStack_180 + fVar9 * fStack_1c0 + fVar10 * fStack_e0 +
                                fVar8 * fStack_1a0 + fVar5 * fStack_220 + (float)puVar2[-10] +
                                fVar11 * fStack_1b0 + fVar3 * fStack_190 + fVar4 * fStack_f0 +
                                fVar6 * fStack_100;
                  puVar2[-9] = fVar7 * fStack_17c + fVar9 * fStack_1bc + fVar10 * fStack_dc +
                               fVar8 * fStack_19c + fVar5 * fStack_21c + (float)puVar2[-9] +
                               fVar11 * fStack_1ac + fVar3 * fStack_18c + fVar4 * fStack_ec +
                               fVar6 * fStack_fc;
                  *(float *)pauVar66[-3] =
                       fVar10 * local_178 +
                       local_138 * fVar8 + fVar5 * fVar58 + fVar11 * local_118 + fVar43 +
                       fVar9 * local_208 +
                       fVar7 * fVar54 + fVar3 * fVar38 + fVar4 * fVar34 + fVar6 * local_168;
                  *(float *)(pauVar66[-3] + 4) =
                       fVar10 * fStack_174 +
                       fStack_134 * fVar8 + fVar5 * fVar59 + fVar11 * fStack_114 + fVar42 +
                       fVar9 * fStack_204 +
                       fVar7 * fVar55 + fVar3 * fVar37 + fVar4 * fVar33 + fVar6 * fStack_164;
                  *(float *)(pauVar66[-3] + 8) =
                       fVar10 * fStack_170 +
                       fStack_130 * fVar8 + fVar5 * fVar60 + fVar11 * fStack_110 + fVar41 +
                       fVar9 * fStack_200 +
                       fVar7 * fVar56 + fVar3 * fVar36 + fVar4 * fVar32 + fVar6 * fStack_160;
                  *(float *)(pauVar66[-3] + 0xc) =
                       fVar10 * fStack_16c +
                       fStack_12c * fVar8 + fVar5 * fVar61 + fVar11 * fStack_10c + fVar40 +
                       fVar9 * fStack_1fc +
                       fVar7 * fVar57 + fVar3 * fVar35 + fVar4 * fVar39 + fVar6 * fStack_15c;
                  fVar3 = *(float *)((long)pvVar90 + lVar76 + 0x14);
                  fVar4 = *(float *)((long)pvVar88 + lVar76 + 0x14);
                  fVar5 = *(float *)((long)pvVar80 + lVar76 + 0x14);
                  fVar6 = *(float *)((long)pvVar90 + lVar76 + 0x18);
                  fVar8 = *(float *)((long)pvVar88 + lVar76 + 0x18);
                  fVar11 = *(float *)((long)pvVar80 + lVar76 + 0x18);
                  fVar43 = *(float *)pauVar66[-2];
                  fVar42 = *(float *)(pauVar66[-2] + 4);
                  fVar41 = *(float *)(pauVar66[-2] + 8);
                  fVar40 = *(float *)(pauVar66[-2] + 0xc);
                  puVar2[-8] = fVar9 * local_1a8 + fVar7 * local_228 + (float)puVar2[-8] +
                               fVar10 * local_1b8 + fVar3 * local_198 + fVar4 * local_f8 +
                               fVar5 * local_108 +
                               fVar6 * local_188 + fVar8 * local_1c8 + fVar11 * local_e8;
                  puVar2[-7] = fVar9 * fStack_1a4 + fVar7 * fStack_224 + (float)puVar2[-7] +
                               fVar10 * fStack_1b4 + fVar3 * fStack_194 + fVar4 * fStack_f4 +
                               fVar5 * fStack_104 +
                               fVar6 * fStack_184 + fVar8 * fStack_1c4 + fVar11 * fStack_e4;
                  puVar2[-6] = fVar9 * fStack_1a0 + fVar7 * fStack_220 + (float)puVar2[-6] +
                               fVar10 * fStack_1b0 + fVar3 * fStack_190 + fVar4 * fStack_f0 +
                               fVar5 * fStack_100 +
                               fVar6 * fStack_180 + fVar8 * fStack_1c0 + fVar11 * fStack_e0;
                  puVar2[-5] = fVar9 * fStack_19c + fVar7 * fStack_21c + (float)puVar2[-5] +
                               fVar10 * fStack_1ac + fVar3 * fStack_18c + fVar4 * fStack_ec +
                               fVar5 * fStack_fc +
                               fVar6 * fStack_17c + fVar8 * fStack_1bc + fVar11 * fStack_dc;
                  *(float *)pauVar66[-2] =
                       fVar9 * local_138 + fVar7 * fVar58 + fVar10 * local_118 + fVar43 +
                       fVar8 * local_208 +
                       fVar3 * fVar38 + fVar4 * fVar34 + fVar5 * local_168 + fVar6 * fVar54 +
                       fVar11 * local_178;
                  *(float *)(pauVar66[-2] + 4) =
                       fVar9 * fStack_134 + fVar7 * fVar59 + fVar10 * fStack_114 + fVar42 +
                       fVar8 * fStack_204 +
                       fVar3 * fVar37 + fVar4 * fVar33 + fVar5 * fStack_164 + fVar6 * fVar55 +
                       fVar11 * fStack_174;
                  *(float *)(pauVar66[-2] + 8) =
                       fVar9 * fStack_130 + fVar7 * fVar60 + fVar10 * fStack_110 + fVar41 +
                       fVar8 * fStack_200 +
                       fVar3 * fVar36 + fVar4 * fVar32 + fVar5 * fStack_160 + fVar6 * fVar56 +
                       fVar11 * fStack_170;
                  *(float *)(pauVar66[-2] + 0xc) =
                       fVar9 * fStack_12c + fVar7 * fVar61 + fVar10 * fStack_10c + fVar40 +
                       fVar8 * fStack_1fc +
                       fVar3 * fVar35 + fVar4 * fVar39 + fVar5 * fStack_15c + fVar6 * fVar57 +
                       fVar11 * fStack_16c;
                  fVar3 = *(float *)((long)pvVar90 + lVar76 + 0x1c);
                  fVar4 = *(float *)((long)pvVar88 + lVar76 + 0x1c);
                  fVar5 = *(float *)((long)pvVar80 + lVar76 + 0x1c);
                  fVar7 = *(float *)((long)pvVar90 + lVar76 + 0x20);
                  fVar9 = *(float *)((long)pvVar88 + lVar76 + 0x20);
                  fVar10 = *(float *)((long)pvVar80 + lVar76 + 0x20);
                  auVar104._0_4_ =
                       fVar7 * local_188 + fVar9 * local_1c8 + fVar10 * local_e8 +
                       fVar8 * local_1a8 + fVar6 * local_228 +
                       fVar11 * local_1b8 + fVar3 * local_198 + fVar4 * local_f8 + fVar5 * local_108
                       + (float)puVar2[-4];
                  auVar104._4_4_ =
                       fVar7 * fStack_184 + fVar9 * fStack_1c4 + fVar10 * fStack_e4 +
                       fVar8 * fStack_1a4 + fVar6 * fStack_224 +
                       fVar11 * fStack_1b4 + fVar3 * fStack_194 +
                       fVar4 * fStack_f4 + fVar5 * fStack_104 + (float)puVar2[-3];
                  auVar104._8_4_ =
                       fVar7 * fStack_180 + fVar9 * fStack_1c0 + fVar10 * fStack_e0 +
                       fVar8 * fStack_1a0 + fVar6 * fStack_220 +
                       fVar11 * fStack_1b0 + fVar3 * fStack_190 +
                       fVar4 * fStack_f0 + fVar5 * fStack_100 + (float)puVar2[-2];
                  auVar104._12_4_ =
                       fVar7 * fStack_17c + fVar9 * fStack_1bc + fVar10 * fStack_dc +
                       fVar8 * fStack_19c + fVar6 * fStack_21c +
                       fVar11 * fStack_1ac + fVar3 * fStack_18c +
                       fVar4 * fStack_ec + fVar5 * fStack_fc + (float)puVar2[-1];
                  auVar101._0_4_ =
                       fVar8 * local_138 + fVar6 * fVar58 + local_118 * fVar11 + fVar3 * fVar38 +
                       fVar5 * local_168 + fVar4 * fVar34 + fVar7 * fVar54 + *(float *)pauVar66[-1]
                       + fVar9 * local_208 + fVar10 * local_178;
                  auVar101._4_4_ =
                       fVar8 * fStack_134 + fVar6 * fVar59 + fStack_114 * fVar11 + fVar3 * fVar37 +
                       fVar5 * fStack_164 + fVar4 * fVar33 + fVar7 * fVar55 +
                       *(float *)(pauVar66[-1] + 4) + fVar9 * fStack_204 + fVar10 * fStack_174;
                  auVar101._8_4_ =
                       fVar8 * fStack_130 + fVar6 * fVar60 + fStack_110 * fVar11 + fVar3 * fVar36 +
                       fVar5 * fStack_160 + fVar4 * fVar32 + fVar7 * fVar56 +
                       *(float *)(pauVar66[-1] + 8) + fVar9 * fStack_200 + fVar10 * fStack_170;
                  auVar101._12_4_ =
                       fVar8 * fStack_12c + fVar6 * fVar61 + fStack_10c * fVar11 + fVar3 * fVar35 +
                       fVar5 * fStack_15c + fVar4 * fVar39 + fVar7 * fVar57 +
                       *(float *)(pauVar66[-1] + 0xc) + fVar9 * fStack_1fc + fVar10 * fStack_16c;
                  *(undefined1 (*) [16])(puVar2 + -4) = auVar104;
                  pauVar66[-1] = auVar101;
                  iVar82 = iVar82 + 4;
                  lVar76 = lVar76 + 0x20;
                } while (iVar82 < (int)uVar29);
                puVar75 = puVar73 + 0x10;
                pauVar83 = pauVar79 + 4;
                pvVar80 = (void *)((long)pvVar80 + lVar76);
                pvVar88 = (void *)((long)pvVar88 + lVar76);
                pvVar90 = (void *)((long)pvVar90 + lVar76);
                auVar107 = ZEXT1664(auVar94);
                uVar69 = uVar29 & 0xfffffffc;
              }
              if ((int)(uVar69 | 1) < (int)uVar29) {
                lVar76 = 0;
                pauVar66 = pauVar83;
                puVar2 = puVar75;
                uVar68 = uVar69;
                do {
                  puVar73 = puVar2;
                  pauVar79 = pauVar66;
                  fVar3 = *(float *)((long)pvVar90 + lVar76);
                  fVar4 = *(float *)((long)pvVar90 + lVar76 + 4);
                  fVar5 = *(float *)((long)pvVar90 + lVar76 + 8);
                  fVar6 = *(float *)((long)pvVar88 + lVar76);
                  fVar7 = *(float *)((long)pvVar88 + lVar76 + 4);
                  fVar8 = *(float *)((long)pvVar88 + lVar76 + 8);
                  fVar9 = *(float *)((long)pvVar80 + lVar76);
                  fVar10 = *(float *)((long)pvVar80 + lVar76 + 4);
                  fVar11 = *(float *)((long)pvVar80 + lVar76 + 8);
                  puVar2 = (undefined4 *)((long)puVar75 + lVar76 * 2 + 0x20);
                  pauVar66 = (undefined1 (*) [16])(pauVar83[2] + lVar76 * 2);
                  fVar43 = *(float *)pauVar66[-2];
                  fVar42 = *(float *)(pauVar66[-2] + 4);
                  fVar41 = *(float *)(pauVar66[-2] + 8);
                  fVar40 = *(float *)(pauVar66[-2] + 0xc);
                  puVar2[-8] = fVar3 * local_228 + (float)puVar2[-8] + fVar7 * local_f8 +
                               fVar9 * local_1b8 + fVar11 * local_e8 +
                               fVar4 * local_198 + fVar5 * local_188 + fVar6 * local_1a8 +
                               fVar8 * local_1c8 + fVar10 * local_108;
                  puVar2[-7] = fVar3 * fStack_224 + (float)puVar2[-7] + fVar7 * fStack_f4 +
                               fVar9 * fStack_1b4 + fVar11 * fStack_e4 +
                               fVar4 * fStack_194 + fVar5 * fStack_184 + fVar6 * fStack_1a4 +
                               fVar8 * fStack_1c4 + fVar10 * fStack_104;
                  puVar2[-6] = fVar3 * fStack_220 + (float)puVar2[-6] + fVar7 * fStack_f0 +
                               fVar9 * fStack_1b0 + fVar11 * fStack_e0 +
                               fVar4 * fStack_190 + fVar5 * fStack_180 + fVar6 * fStack_1a0 +
                               fVar8 * fStack_1c0 + fVar10 * fStack_100;
                  puVar2[-5] = fVar3 * fStack_21c + (float)puVar2[-5] + fVar7 * fStack_ec +
                               fVar9 * fStack_1ac + fVar11 * fStack_dc +
                               fVar4 * fStack_18c + fVar5 * fStack_17c + fVar6 * fStack_19c +
                               fVar8 * fStack_1bc + fVar10 * fStack_fc;
                  *(float *)pauVar66[-2] =
                       fVar11 * local_178 +
                       fVar3 * fVar58 + fVar43 + fVar7 * fVar34 + fVar9 * local_118 +
                       fVar4 * fVar38 + fVar5 * fVar54 + fVar6 * local_138 + fVar8 * local_208 +
                       fVar10 * local_168;
                  *(float *)(pauVar66[-2] + 4) =
                       fVar11 * fStack_174 +
                       fVar3 * fVar59 + fVar42 + fVar7 * fVar33 + fVar9 * fStack_114 +
                       fVar4 * fVar37 + fVar5 * fVar55 + fVar6 * fStack_134 + fVar8 * fStack_204 +
                       fVar10 * fStack_164;
                  *(float *)(pauVar66[-2] + 8) =
                       fVar11 * fStack_170 +
                       fVar3 * fVar60 + fVar41 + fVar7 * fVar32 + fVar9 * fStack_110 +
                       fVar4 * fVar36 + fVar5 * fVar56 + fVar6 * fStack_130 + fVar8 * fStack_200 +
                       fVar10 * fStack_160;
                  *(float *)(pauVar66[-2] + 0xc) =
                       fVar11 * fStack_16c +
                       fVar3 * fVar61 + fVar40 + fVar7 * fVar39 + fVar9 * fStack_10c +
                       fVar4 * fVar35 + fVar5 * fVar57 + fVar6 * fStack_12c + fVar8 * fStack_1fc +
                       fVar10 * fStack_15c;
                  fVar3 = *(float *)((long)pvVar90 + lVar76 + 0xc);
                  fVar4 = *(float *)((long)pvVar88 + lVar76 + 0xc);
                  fVar6 = *(float *)((long)pvVar80 + lVar76 + 0xc);
                  fVar7 = *(float *)((long)pvVar90 + lVar76 + 0x10);
                  fVar9 = *(float *)((long)pvVar88 + lVar76 + 0x10);
                  fVar10 = *(float *)((long)pvVar80 + lVar76 + 0x10);
                  auVar105._0_4_ =
                       fVar7 * local_188 + fVar9 * local_1c8 + fVar10 * local_e8 +
                       fVar11 * local_1b8 + fVar3 * local_198 + fVar4 * local_f8 + fVar6 * local_108
                       + fVar8 * local_1a8 + fVar5 * local_228 + (float)puVar2[-4];
                  auVar105._4_4_ =
                       fVar7 * fStack_184 + fVar9 * fStack_1c4 + fVar10 * fStack_e4 +
                       fVar11 * fStack_1b4 + fVar3 * fStack_194 + fVar4 * fStack_f4 +
                       fVar6 * fStack_104 +
                       fVar8 * fStack_1a4 + fVar5 * fStack_224 + (float)puVar2[-3];
                  auVar105._8_4_ =
                       fVar7 * fStack_180 + fVar9 * fStack_1c0 + fVar10 * fStack_e0 +
                       fVar11 * fStack_1b0 + fVar3 * fStack_190 + fVar4 * fStack_f0 +
                       fVar6 * fStack_100 +
                       fVar8 * fStack_1a0 + fVar5 * fStack_220 + (float)puVar2[-2];
                  auVar105._12_4_ =
                       fVar7 * fStack_17c + fVar9 * fStack_1bc + fVar10 * fStack_dc +
                       fVar11 * fStack_1ac + fVar3 * fStack_18c + fVar4 * fStack_ec +
                       fVar6 * fStack_fc +
                       fVar8 * fStack_19c + fVar5 * fStack_21c + (float)puVar2[-1];
                  auVar102._0_4_ =
                       fVar8 * local_138 + fVar58 * fVar5 + local_118 * fVar11 +
                       *(float *)pauVar66[-1] +
                       fVar3 * fVar38 + fVar4 * fVar34 + fVar6 * local_168 + fVar7 * fVar54 +
                       fVar9 * local_208 + fVar10 * local_178;
                  auVar102._4_4_ =
                       fVar8 * fStack_134 + fVar59 * fVar5 + fStack_114 * fVar11 +
                       *(float *)(pauVar66[-1] + 4) +
                       fVar3 * fVar37 + fVar4 * fVar33 + fVar6 * fStack_164 + fVar7 * fVar55 +
                       fVar9 * fStack_204 + fVar10 * fStack_174;
                  auVar102._8_4_ =
                       fVar8 * fStack_130 + fVar60 * fVar5 + fStack_110 * fVar11 +
                       *(float *)(pauVar66[-1] + 8) +
                       fVar3 * fVar36 + fVar4 * fVar32 + fVar6 * fStack_160 + fVar7 * fVar56 +
                       fVar9 * fStack_200 + fVar10 * fStack_170;
                  auVar102._12_4_ =
                       fVar8 * fStack_12c + fVar61 * fVar5 + fStack_10c * fVar11 +
                       *(float *)(pauVar66[-1] + 0xc) +
                       fVar3 * fVar35 + fVar4 * fVar39 + fVar6 * fStack_15c + fVar7 * fVar57 +
                       fVar9 * fStack_1fc + fVar10 * fStack_16c;
                  *(undefined1 (*) [16])(puVar2 + -4) = auVar105;
                  pauVar66[-1] = auVar102;
                  uVar69 = uVar68 + 2;
                  iVar82 = uVar68 + 3;
                  lVar76 = lVar76 + 0x10;
                  uVar68 = uVar69;
                } while (iVar82 < (int)uVar29);
                puVar75 = puVar73 + 8;
                pauVar83 = pauVar79 + 2;
                pvVar80 = (void *)((long)pvVar80 + lVar76);
                pvVar88 = (void *)((long)pvVar88 + lVar76);
                pvVar90 = (void *)((long)pvVar90 + lVar76);
                auVar107 = ZEXT1664(auVar94);
              }
              iVar82 = uVar29 - uVar69;
              if (iVar82 != 0 && (int)uVar69 <= (int)uVar29) {
                lVar76 = 0;
                lVar74 = 0;
                auVar108 = auVar107;
                do {
                  fVar3 = *(float *)((long)pvVar90 + lVar74);
                  fVar4 = *(float *)((long)pvVar90 + lVar74 + 4);
                  fVar5 = *(float *)((long)pvVar90 + lVar74 + 8);
                  fVar6 = *(float *)((long)pvVar88 + lVar74);
                  fVar7 = *(float *)((long)pvVar88 + lVar74 + 4);
                  fVar8 = *(float *)((long)pvVar88 + lVar74 + 8);
                  fVar9 = *(float *)((long)pvVar80 + lVar74);
                  fVar10 = *(float *)((long)pvVar80 + lVar74 + 4);
                  fVar11 = *(float *)((long)pvVar80 + lVar74 + 8);
                  pfVar84 = (float *)((long)puVar75 + lVar74 * 2);
                  auVar106._0_4_ =
                       fVar3 * local_228 + *pfVar84 + fVar7 * local_f8 + fVar9 * local_1b8 +
                       fVar11 * local_e8 +
                       fVar4 * local_198 + fVar5 * local_188 + fVar6 * local_1a8 + fVar8 * local_1c8
                       + fVar10 * local_108;
                  auVar106._4_4_ =
                       fVar3 * fStack_224 + pfVar84[1] + fVar7 * fStack_f4 + fVar9 * fStack_1b4 +
                       fVar11 * fStack_e4 +
                       fVar4 * fStack_194 + fVar5 * fStack_184 + fVar6 * fStack_1a4 +
                       fVar8 * fStack_1c4 + fVar10 * fStack_104;
                  auVar106._8_4_ =
                       fVar3 * fStack_220 + pfVar84[2] + fVar7 * fStack_f0 + fVar9 * fStack_1b0 +
                       fVar11 * fStack_e0 +
                       fVar4 * fStack_190 + fVar5 * fStack_180 + fVar6 * fStack_1a0 +
                       fVar8 * fStack_1c0 + fVar10 * fStack_100;
                  auVar106._12_4_ =
                       fVar3 * fStack_21c + pfVar84[3] + fVar7 * fStack_ec + fVar9 * fStack_1ac +
                       fVar11 * fStack_dc +
                       fVar4 * fStack_18c + fVar5 * fStack_17c + fVar6 * fStack_19c +
                       fVar8 * fStack_1bc + fVar10 * fStack_fc;
                  auVar107 = ZEXT1664(auVar108._0_16_);
                  pfVar84 = (float *)((long)*pauVar83 + lVar74 * 2);
                  auVar103._0_4_ =
                       fVar7 * fVar34 + fVar58 * fVar3 + *pfVar84 + fVar9 * local_118 +
                       fVar11 * local_178 +
                       fVar6 * auVar108._0_4_ + fVar5 * fVar54 + fVar38 * fVar4 + fVar8 * local_208
                       + fVar10 * local_168;
                  auVar103._4_4_ =
                       fVar7 * fVar33 + fVar59 * fVar3 + pfVar84[1] + fVar9 * fStack_114 +
                       fVar11 * fStack_174 +
                       fVar6 * auVar108._4_4_ + fVar5 * fVar55 + fVar37 * fVar4 + fVar8 * fStack_204
                       + fVar10 * fStack_164;
                  auVar103._8_4_ =
                       fVar7 * fVar32 + fVar60 * fVar3 + pfVar84[2] + fVar9 * fStack_110 +
                       fVar11 * fStack_170 +
                       fVar6 * auVar108._8_4_ + fVar5 * fVar56 + fVar36 * fVar4 + fVar8 * fStack_200
                       + fVar10 * fStack_160;
                  auVar103._12_4_ =
                       fVar7 * fVar39 + fVar61 * fVar3 + pfVar84[3] + fVar9 * fStack_10c +
                       fVar11 * fStack_16c +
                       fVar6 * auVar108._12_4_ + fVar5 * fVar57 + fVar35 * fVar4 +
                       fVar8 * fStack_1fc + fVar10 * fStack_15c;
                  *(undefined1 (*) [16])((long)puVar75 + lVar74 * 2) = auVar106;
                  *(undefined1 (*) [16])((long)*pauVar83 + lVar74 * 2) = auVar103;
                  lVar74 = lVar74 + 8;
                  lVar76 = lVar76 + -0x10;
                  iVar82 = iVar82 + -1;
                  auVar108 = auVar107;
                } while (iVar82 != 0);
                pvVar80 = (void *)((long)pvVar80 + lVar74);
                pvVar88 = (void *)((long)pvVar88 + lVar74);
                pvVar90 = (void *)((long)pvVar90 + lVar74);
                pauVar83 = (undefined1 (*) [16])((long)pauVar83 - lVar76);
                puVar75 = (undefined4 *)((long)puVar75 - lVar76);
              }
              pvVar90 = (void *)((long)pvVar90 + lVar91 * 4);
              pvVar88 = (void *)((long)pvVar88 + lVar91 * 4);
              pvVar80 = (void *)((long)pvVar80 + lVar91 * 4);
              iVar67 = iVar67 + 1;
            } while (iVar67 != iVar30);
          }
          local_98 = local_98 + 0x12;
          pfVar86 = pfVar86 + 0x24;
          local_148 = local_148 + 1;
        } while (local_148 != uVar28);
      }
      uVar87 = uVar87 + 1;
    } while (uVar87 != (uint)(iVar31 >> 1));
  }
  if ((int)uVar81 != iVar31) {
    do {
      uVar70 = (long)top_blob->h * (long)top_blob->w;
      uVar87 = top_blob->elemsize;
      uVar71 = (uVar87 * uVar70 + 0xf & 0xfffffffffffffff0) / uVar87;
      if (top_blob->dims == 4) {
        uVar71 = uVar70;
      }
      if (_bias == (Mat *)0x0) {
        auVar92 = ZEXT816(0) << 0x40;
      }
      else {
        auVar92 = *(undefined1 (*) [16])(&_bias->data + uVar81 * 2);
      }
      pauVar83 = (undefined1 (*) [16])(top_blob->cstep * uVar81 * uVar87 + (long)top_blob->data);
      iVar67 = (int)uVar71 * top_blob->d;
      pauVar77 = pauVar83;
      if (0 < iVar67) {
        do {
          *pauVar77 = auVar92;
          iVar67 = iVar67 + -1;
          pauVar77 = pauVar77 + 1;
        } while (iVar67 != 0);
      }
      if (0 < (int)uVar28) {
        pfVar86 = (float *)(kernel->cstep * uVar81 * kernel->elemsize + (long)kernel->data);
        uVar87 = 0;
        do {
          if (0 < iVar30) {
            fVar58 = *pfVar86;
            fVar59 = pfVar86[1];
            fVar60 = pfVar86[2];
            fVar61 = pfVar86[3];
            fVar54 = pfVar86[4];
            fVar55 = pfVar86[5];
            fVar56 = pfVar86[6];
            fVar57 = pfVar86[7];
            auVar92 = *(undefined1 (*) [16])(pfVar86 + 8);
            auVar21 = *(undefined1 (*) [16])(pfVar86 + 0xc);
            auVar22 = *(undefined1 (*) [16])(pfVar86 + 0x10);
            auVar23 = *(undefined1 (*) [16])(pfVar86 + 0x14);
            auVar24 = *(undefined1 (*) [16])(pfVar86 + 0x18);
            auVar25 = *(undefined1 (*) [16])(pfVar86 + 0x1c);
            auVar26 = *(undefined1 (*) [16])(pfVar86 + 0x20);
            pfVar78 = (float *)(bottom_blob->cstep * uVar87 * bottom_blob->elemsize +
                               (long)bottom_blob->data);
            lVar76 = (long)bottom_blob->w * bottom_blob->elemsize;
            pfVar84 = (float *)((long)pfVar78 + lVar76 * 2);
            pfVar89 = (float *)(lVar76 + (long)pfVar78);
            iVar67 = 0;
            pauVar77 = pauVar83;
            do {
              fVar8 = auVar21._4_4_;
              fVar40 = auVar21._8_4_;
              fVar44 = auVar21._12_4_;
              fVar39 = auVar92._4_4_;
              fVar41 = auVar92._8_4_;
              fVar45 = auVar92._12_4_;
              fVar3 = auVar23._4_4_;
              fVar42 = auVar23._8_4_;
              fVar46 = auVar23._12_4_;
              fVar4 = auVar24._4_4_;
              fVar9 = auVar24._8_4_;
              fVar47 = auVar24._12_4_;
              fVar5 = auVar22._4_4_;
              fVar43 = auVar22._8_4_;
              fVar48 = auVar22._12_4_;
              fVar6 = auVar25._4_4_;
              fVar11 = auVar25._8_4_;
              fVar49 = auVar25._12_4_;
              fVar7 = auVar26._4_4_;
              fVar10 = auVar26._8_4_;
              fVar50 = auVar26._12_4_;
              fVar32 = auVar92._0_4_;
              fVar33 = auVar21._0_4_;
              fVar34 = auVar22._0_4_;
              fVar35 = auVar23._0_4_;
              fVar36 = auVar24._0_4_;
              fVar37 = auVar25._0_4_;
              fVar38 = auVar26._0_4_;
              if ((int)uVar29 < 8) {
                uVar69 = 0;
              }
              else {
                iVar82 = 7;
                do {
                  fVar12 = *pfVar78;
                  fVar13 = pfVar78[1];
                  fVar14 = pfVar78[2];
                  fVar15 = *pfVar89;
                  fVar16 = pfVar89[1];
                  fVar17 = pfVar89[2];
                  fVar18 = *pfVar84;
                  fVar19 = pfVar84[1];
                  fVar51 = *(float *)((long)*pauVar77 + 4);
                  fVar52 = *(float *)((long)*pauVar77 + 8);
                  fVar53 = *(float *)((long)*pauVar77 + 0xc);
                  fVar20 = pfVar84[2];
                  *(float *)*pauVar77 =
                       fVar12 * fVar58 + *(float *)*pauVar77 + fVar16 * fVar34 + fVar18 * fVar36 +
                       fVar20 * fVar38 +
                       fVar13 * fVar54 + fVar14 * fVar32 + fVar15 * fVar33 + fVar17 * fVar35 +
                       fVar19 * fVar37;
                  *(float *)((long)*pauVar77 + 4) =
                       fVar12 * fVar59 + fVar51 + fVar16 * fVar5 + fVar18 * fVar4 + fVar20 * fVar7 +
                       fVar13 * fVar55 + fVar14 * fVar39 + fVar15 * fVar8 + fVar17 * fVar3 +
                       fVar19 * fVar6;
                  *(float *)((long)*pauVar77 + 8) =
                       fVar12 * fVar60 + fVar52 + fVar16 * fVar43 + fVar18 * fVar9 + fVar20 * fVar10
                       + fVar13 * fVar56 + fVar14 * fVar41 + fVar15 * fVar40 + fVar17 * fVar42 +
                         fVar19 * fVar11;
                  *(float *)((long)*pauVar77 + 0xc) =
                       fVar12 * fVar61 + fVar53 + fVar16 * fVar48 + fVar18 * fVar47 +
                       fVar20 * fVar50 +
                       fVar13 * fVar57 + fVar14 * fVar45 + fVar15 * fVar44 + fVar17 * fVar46 +
                       fVar19 * fVar49;
                  fVar12 = pfVar78[3];
                  fVar13 = pfVar78[4];
                  fVar15 = pfVar89[4];
                  fVar16 = pfVar89[3];
                  fVar18 = pfVar84[3];
                  fVar19 = pfVar84[4];
                  fVar51 = *(float *)(pauVar77[1] + 4);
                  fVar52 = *(float *)(pauVar77[1] + 8);
                  fVar53 = *(float *)(pauVar77[1] + 0xc);
                  *(float *)pauVar77[1] =
                       fVar17 * fVar33 + fVar14 * fVar58 + *(float *)pauVar77[1] +
                       fVar20 * fVar36 + fVar12 * fVar54 + fVar16 * fVar34 + fVar18 * fVar37 +
                       fVar13 * fVar32 + fVar15 * fVar35 + fVar19 * fVar38;
                  *(float *)(pauVar77[1] + 4) =
                       fVar17 * fVar8 + fVar14 * fVar59 + fVar51 +
                       fVar20 * fVar4 + fVar12 * fVar55 + fVar16 * fVar5 + fVar18 * fVar6 +
                       fVar13 * fVar39 + fVar15 * fVar3 + fVar19 * fVar7;
                  *(float *)(pauVar77[1] + 8) =
                       fVar17 * fVar40 + fVar14 * fVar60 + fVar52 +
                       fVar20 * fVar9 + fVar12 * fVar56 + fVar16 * fVar43 + fVar18 * fVar11 +
                       fVar13 * fVar41 + fVar15 * fVar42 + fVar19 * fVar10;
                  *(float *)(pauVar77[1] + 0xc) =
                       fVar17 * fVar44 + fVar14 * fVar61 + fVar53 +
                       fVar20 * fVar47 + fVar12 * fVar57 + fVar16 * fVar48 + fVar18 * fVar49 +
                       fVar13 * fVar45 + fVar15 * fVar46 + fVar19 * fVar50;
                  fVar12 = pfVar78[5];
                  fVar14 = pfVar89[5];
                  fVar51 = *(float *)(pauVar77[2] + 4);
                  fVar52 = *(float *)(pauVar77[2] + 8);
                  fVar53 = *(float *)(pauVar77[2] + 0xc);
                  fVar16 = pfVar84[5];
                  fVar17 = pfVar78[6];
                  fVar18 = pfVar89[6];
                  fVar20 = pfVar84[6];
                  *(float *)pauVar77[2] =
                       fVar13 * fVar58 + *(float *)pauVar77[2] + fVar14 * fVar34 + fVar17 * fVar32 +
                       fVar20 * fVar38 +
                       fVar15 * fVar33 + fVar19 * fVar36 + fVar12 * fVar54 + fVar16 * fVar37 +
                       fVar18 * fVar35;
                  *(float *)(pauVar77[2] + 4) =
                       fVar13 * fVar59 + fVar51 + fVar14 * fVar5 + fVar17 * fVar39 + fVar20 * fVar7
                       + fVar15 * fVar8 + fVar19 * fVar4 + fVar12 * fVar55 + fVar16 * fVar6 +
                         fVar18 * fVar3;
                  *(float *)(pauVar77[2] + 8) =
                       fVar13 * fVar60 + fVar52 + fVar14 * fVar43 + fVar17 * fVar41 +
                       fVar20 * fVar10 +
                       fVar15 * fVar40 + fVar19 * fVar9 + fVar12 * fVar56 + fVar16 * fVar11 +
                       fVar18 * fVar42;
                  *(float *)(pauVar77[2] + 0xc) =
                       fVar13 * fVar61 + fVar53 + fVar14 * fVar48 + fVar17 * fVar45 +
                       fVar20 * fVar50 +
                       fVar15 * fVar44 + fVar19 * fVar47 + fVar12 * fVar57 + fVar16 * fVar49 +
                       fVar18 * fVar46;
                  fVar12 = pfVar78[7];
                  fVar13 = pfVar78[8];
                  fVar14 = pfVar89[8];
                  fVar15 = pfVar89[7];
                  fVar16 = pfVar84[7];
                  fVar19 = pfVar84[8];
                  fVar51 = *(float *)(pauVar77[3] + 4);
                  fVar52 = *(float *)(pauVar77[3] + 8);
                  fVar53 = *(float *)(pauVar77[3] + 0xc);
                  *(float *)pauVar77[3] =
                       fVar13 * fVar32 + fVar14 * fVar35 + fVar19 * fVar38 +
                       fVar15 * fVar34 + fVar16 * fVar37 +
                       fVar20 * fVar36 + fVar12 * fVar54 + fVar17 * fVar58 + fVar18 * fVar33 +
                       *(float *)pauVar77[3];
                  *(float *)(pauVar77[3] + 4) =
                       fVar13 * fVar39 + fVar14 * fVar3 + fVar19 * fVar7 +
                       fVar15 * fVar5 + fVar16 * fVar6 +
                       fVar20 * fVar4 + fVar12 * fVar55 + fVar17 * fVar59 + fVar18 * fVar8 + fVar51;
                  *(float *)(pauVar77[3] + 8) =
                       fVar13 * fVar41 + fVar14 * fVar42 + fVar19 * fVar10 +
                       fVar15 * fVar43 + fVar16 * fVar11 +
                       fVar20 * fVar9 + fVar12 * fVar56 + fVar17 * fVar60 + fVar18 * fVar40 + fVar52
                  ;
                  *(float *)(pauVar77[3] + 0xc) =
                       fVar13 * fVar45 + fVar14 * fVar46 + fVar19 * fVar50 +
                       fVar15 * fVar48 + fVar16 * fVar49 +
                       fVar20 * fVar47 + fVar12 * fVar57 + fVar17 * fVar61 + fVar18 * fVar44 +
                       fVar53;
                  fVar12 = pfVar78[9];
                  fVar15 = pfVar78[10];
                  fVar16 = pfVar89[10];
                  fVar17 = pfVar89[9];
                  fVar18 = pfVar84[9];
                  fVar20 = pfVar84[10];
                  fVar51 = *(float *)(pauVar77[4] + 4);
                  fVar52 = *(float *)(pauVar77[4] + 8);
                  fVar53 = *(float *)(pauVar77[4] + 0xc);
                  *(float *)pauVar77[4] =
                       fVar15 * fVar32 + fVar16 * fVar35 + fVar20 * fVar38 +
                       fVar17 * fVar34 + fVar18 * fVar37 +
                       fVar14 * fVar33 + fVar13 * fVar58 + fVar19 * fVar36 + fVar12 * fVar54 +
                       *(float *)pauVar77[4];
                  *(float *)(pauVar77[4] + 4) =
                       fVar15 * fVar39 + fVar16 * fVar3 + fVar20 * fVar7 +
                       fVar17 * fVar5 + fVar18 * fVar6 +
                       fVar14 * fVar8 + fVar13 * fVar59 + fVar19 * fVar4 + fVar12 * fVar55 + fVar51;
                  *(float *)(pauVar77[4] + 8) =
                       fVar15 * fVar41 + fVar16 * fVar42 + fVar20 * fVar10 +
                       fVar17 * fVar43 + fVar18 * fVar11 +
                       fVar14 * fVar40 + fVar13 * fVar60 + fVar19 * fVar9 + fVar12 * fVar56 + fVar52
                  ;
                  *(float *)(pauVar77[4] + 0xc) =
                       fVar15 * fVar45 + fVar16 * fVar46 + fVar20 * fVar50 +
                       fVar17 * fVar48 + fVar18 * fVar49 +
                       fVar14 * fVar44 + fVar13 * fVar61 + fVar19 * fVar47 + fVar12 * fVar57 +
                       fVar53;
                  fVar12 = pfVar78[0xb];
                  fVar13 = pfVar78[0xc];
                  fVar14 = pfVar89[0xc];
                  fVar17 = pfVar89[0xb];
                  fVar18 = pfVar84[0xb];
                  fVar19 = pfVar84[0xc];
                  fVar51 = *(float *)(pauVar77[5] + 4);
                  fVar52 = *(float *)(pauVar77[5] + 8);
                  fVar53 = *(float *)(pauVar77[5] + 0xc);
                  *(float *)pauVar77[5] =
                       fVar13 * fVar32 + fVar14 * fVar35 + fVar19 * fVar38 +
                       fVar17 * fVar34 + fVar18 * fVar37 +
                       fVar16 * fVar33 + fVar15 * fVar58 + fVar20 * fVar36 + fVar12 * fVar54 +
                       *(float *)pauVar77[5];
                  *(float *)(pauVar77[5] + 4) =
                       fVar13 * fVar39 + fVar14 * fVar3 + fVar19 * fVar7 +
                       fVar17 * fVar5 + fVar18 * fVar6 +
                       fVar16 * fVar8 + fVar15 * fVar59 + fVar20 * fVar4 + fVar12 * fVar55 + fVar51;
                  *(float *)(pauVar77[5] + 8) =
                       fVar13 * fVar41 + fVar14 * fVar42 + fVar19 * fVar10 +
                       fVar17 * fVar43 + fVar18 * fVar11 +
                       fVar16 * fVar40 + fVar15 * fVar60 + fVar20 * fVar9 + fVar12 * fVar56 + fVar52
                  ;
                  *(float *)(pauVar77[5] + 0xc) =
                       fVar13 * fVar45 + fVar14 * fVar46 + fVar19 * fVar50 +
                       fVar17 * fVar48 + fVar18 * fVar49 +
                       fVar16 * fVar44 + fVar15 * fVar61 + fVar20 * fVar47 + fVar12 * fVar57 +
                       fVar53;
                  fVar12 = pfVar78[0xd];
                  fVar15 = pfVar78[0xe];
                  fVar16 = pfVar89[0xe];
                  fVar17 = pfVar89[0xd];
                  fVar18 = pfVar84[0xd];
                  fVar20 = pfVar84[0xe];
                  fVar51 = *(float *)(pauVar77[6] + 4);
                  fVar52 = *(float *)(pauVar77[6] + 8);
                  fVar53 = *(float *)(pauVar77[6] + 0xc);
                  *(float *)pauVar77[6] =
                       fVar15 * fVar32 + fVar16 * fVar35 + fVar20 * fVar38 +
                       fVar17 * fVar34 + fVar18 * fVar37 +
                       fVar14 * fVar33 + fVar13 * fVar58 + fVar19 * fVar36 + fVar12 * fVar54 +
                       *(float *)pauVar77[6];
                  *(float *)(pauVar77[6] + 4) =
                       fVar15 * fVar39 + fVar16 * fVar3 + fVar20 * fVar7 +
                       fVar17 * fVar5 + fVar18 * fVar6 +
                       fVar14 * fVar8 + fVar13 * fVar59 + fVar19 * fVar4 + fVar12 * fVar55 + fVar51;
                  *(float *)(pauVar77[6] + 8) =
                       fVar15 * fVar41 + fVar16 * fVar42 + fVar20 * fVar10 +
                       fVar17 * fVar43 + fVar18 * fVar11 +
                       fVar14 * fVar40 + fVar13 * fVar60 + fVar19 * fVar9 + fVar12 * fVar56 + fVar52
                  ;
                  *(float *)(pauVar77[6] + 0xc) =
                       fVar15 * fVar45 + fVar16 * fVar46 + fVar20 * fVar50 +
                       fVar17 * fVar48 + fVar18 * fVar49 +
                       fVar14 * fVar44 + fVar13 * fVar61 + fVar19 * fVar47 + fVar12 * fVar57 +
                       fVar53;
                  fVar12 = pfVar78[0x10];
                  fVar13 = pfVar89[0x10];
                  fVar14 = pfVar78[0xf];
                  fVar17 = pfVar89[0xf];
                  fVar18 = pfVar84[0xf];
                  fVar19 = pfVar84[0x10];
                  auVar93._0_4_ =
                       fVar12 * fVar32 + fVar13 * fVar35 + fVar19 * fVar38 +
                       fVar17 * fVar34 + fVar18 * fVar37 +
                       fVar20 * fVar36 + fVar14 * fVar54 + fVar16 * fVar33 + fVar15 * fVar58 +
                       *(float *)pauVar77[7];
                  auVar93._4_4_ =
                       fVar12 * fVar39 + fVar13 * fVar3 + fVar19 * fVar7 +
                       fVar17 * fVar5 + fVar18 * fVar6 +
                       fVar20 * fVar4 + fVar14 * fVar55 + fVar16 * fVar8 + fVar15 * fVar59 +
                       *(float *)(pauVar77[7] + 4);
                  auVar93._8_4_ =
                       fVar12 * fVar41 + fVar13 * fVar42 + fVar19 * fVar10 +
                       fVar17 * fVar43 + fVar18 * fVar11 +
                       fVar20 * fVar9 + fVar14 * fVar56 + fVar16 * fVar40 + fVar15 * fVar60 +
                       *(float *)(pauVar77[7] + 8);
                  auVar93._12_4_ =
                       fVar12 * fVar45 + fVar13 * fVar46 + fVar19 * fVar50 +
                       fVar17 * fVar48 + fVar18 * fVar49 +
                       fVar20 * fVar47 + fVar14 * fVar57 + fVar16 * fVar44 + fVar15 * fVar61 +
                       *(float *)(pauVar77[7] + 0xc);
                  pauVar77[7] = auVar93;
                  pfVar78 = pfVar78 + 0x10;
                  pfVar89 = pfVar89 + 0x10;
                  pfVar84 = pfVar84 + 0x10;
                  pauVar77 = pauVar77 + 8;
                  iVar82 = iVar82 + 8;
                  uVar69 = uVar29 & 0xfffffff8;
                } while (iVar82 < (int)uVar29);
              }
              if ((int)(uVar69 | 3) < (int)uVar29) {
                lVar76 = 0;
                pauVar66 = pauVar77;
                uVar68 = uVar69;
                do {
                  pauVar79 = pauVar66;
                  fVar12 = *(float *)((long)pfVar78 + lVar76);
                  fVar13 = *(float *)((long)pfVar78 + lVar76 + 4);
                  fVar14 = *(float *)((long)pfVar78 + lVar76 + 8);
                  fVar15 = *(float *)((long)pfVar89 + lVar76);
                  fVar16 = *(float *)((long)pfVar89 + lVar76 + 4);
                  fVar17 = *(float *)((long)pfVar89 + lVar76 + 8);
                  fVar18 = *(float *)((long)pfVar84 + lVar76);
                  fVar19 = *(float *)((long)pfVar84 + lVar76 + 4);
                  pauVar66 = (undefined1 (*) [16])(pauVar77[4] + lVar76 * 2);
                  fVar51 = *(float *)(pauVar66[-4] + 4);
                  fVar52 = *(float *)(pauVar66[-4] + 8);
                  fVar53 = *(float *)(pauVar66[-4] + 0xc);
                  fVar20 = *(float *)((long)pfVar84 + lVar76 + 8);
                  *(float *)pauVar66[-4] =
                       fVar13 * fVar54 + fVar14 * fVar32 + fVar15 * fVar33 + fVar17 * fVar35 +
                       fVar19 * fVar37 +
                       fVar20 * fVar38 +
                       fVar18 * fVar36 + fVar16 * fVar34 + fVar58 * fVar12 + *(float *)pauVar66[-4];
                  *(float *)(pauVar66[-4] + 4) =
                       fVar13 * fVar55 + fVar14 * fVar39 + fVar15 * fVar8 + fVar17 * fVar3 +
                       fVar19 * fVar6 +
                       fVar20 * fVar7 + fVar18 * fVar4 + fVar16 * fVar5 + fVar59 * fVar12 + fVar51;
                  *(float *)(pauVar66[-4] + 8) =
                       fVar13 * fVar56 + fVar14 * fVar41 + fVar15 * fVar40 + fVar17 * fVar42 +
                       fVar19 * fVar11 +
                       fVar20 * fVar10 + fVar18 * fVar9 + fVar16 * fVar43 + fVar60 * fVar12 + fVar52
                  ;
                  *(float *)(pauVar66[-4] + 0xc) =
                       fVar13 * fVar57 + fVar14 * fVar45 + fVar15 * fVar44 + fVar17 * fVar46 +
                       fVar19 * fVar49 +
                       fVar20 * fVar50 +
                       fVar18 * fVar47 + fVar16 * fVar48 + fVar61 * fVar12 + fVar53;
                  fVar12 = *(float *)((long)pfVar78 + lVar76 + 0xc);
                  fVar13 = *(float *)((long)pfVar78 + lVar76 + 0x10);
                  fVar15 = *(float *)((long)pfVar89 + lVar76 + 0x10);
                  fVar16 = *(float *)((long)pfVar89 + lVar76 + 0xc);
                  fVar18 = *(float *)((long)pfVar84 + lVar76 + 0xc);
                  fVar19 = *(float *)((long)pfVar84 + lVar76 + 0x10);
                  fVar51 = *(float *)(pauVar66[-3] + 4);
                  fVar52 = *(float *)(pauVar66[-3] + 8);
                  fVar53 = *(float *)(pauVar66[-3] + 0xc);
                  *(float *)pauVar66[-3] =
                       fVar13 * fVar32 + fVar15 * fVar35 + fVar19 * fVar38 +
                       fVar17 * fVar33 + fVar14 * fVar58 + *(float *)pauVar66[-3] +
                       fVar18 * fVar37 + fVar16 * fVar34 + fVar20 * fVar36 + fVar12 * fVar54;
                  *(float *)(pauVar66[-3] + 4) =
                       fVar13 * fVar39 + fVar15 * fVar3 + fVar19 * fVar7 +
                       fVar17 * fVar8 + fVar14 * fVar59 + fVar51 +
                       fVar18 * fVar6 + fVar16 * fVar5 + fVar20 * fVar4 + fVar12 * fVar55;
                  *(float *)(pauVar66[-3] + 8) =
                       fVar13 * fVar41 + fVar15 * fVar42 + fVar19 * fVar10 +
                       fVar17 * fVar40 + fVar14 * fVar60 + fVar52 +
                       fVar18 * fVar11 + fVar16 * fVar43 + fVar20 * fVar9 + fVar12 * fVar56;
                  *(float *)(pauVar66[-3] + 0xc) =
                       fVar13 * fVar45 + fVar15 * fVar46 + fVar19 * fVar50 +
                       fVar17 * fVar44 + fVar14 * fVar61 + fVar53 +
                       fVar18 * fVar49 + fVar16 * fVar48 + fVar20 * fVar47 + fVar12 * fVar57;
                  fVar12 = *(float *)((long)pfVar78 + lVar76 + 0x14);
                  fVar14 = *(float *)((long)pfVar89 + lVar76 + 0x14);
                  fVar51 = *(float *)(pauVar66[-2] + 4);
                  fVar52 = *(float *)(pauVar66[-2] + 8);
                  fVar53 = *(float *)(pauVar66[-2] + 0xc);
                  fVar16 = *(float *)((long)pfVar78 + lVar76 + 0x18);
                  fVar17 = *(float *)((long)pfVar84 + lVar76 + 0x14);
                  fVar18 = *(float *)((long)pfVar89 + lVar76 + 0x18);
                  fVar20 = *(float *)((long)pfVar84 + lVar76 + 0x18);
                  *(float *)pauVar66[-2] =
                       fVar13 * fVar58 + *(float *)pauVar66[-2] + fVar14 * fVar34 + fVar16 * fVar32
                       + fVar20 * fVar38 +
                       fVar18 * fVar35 +
                       fVar17 * fVar37 + fVar15 * fVar33 + fVar19 * fVar36 + fVar12 * fVar54;
                  *(float *)(pauVar66[-2] + 4) =
                       fVar13 * fVar59 + fVar51 + fVar14 * fVar5 + fVar16 * fVar39 + fVar20 * fVar7
                       + fVar18 * fVar3 +
                         fVar17 * fVar6 + fVar15 * fVar8 + fVar19 * fVar4 + fVar12 * fVar55;
                  *(float *)(pauVar66[-2] + 8) =
                       fVar13 * fVar60 + fVar52 + fVar14 * fVar43 + fVar16 * fVar41 +
                       fVar20 * fVar10 +
                       fVar18 * fVar42 +
                       fVar17 * fVar11 + fVar15 * fVar40 + fVar19 * fVar9 + fVar12 * fVar56;
                  *(float *)(pauVar66[-2] + 0xc) =
                       fVar13 * fVar61 + fVar53 + fVar14 * fVar48 + fVar16 * fVar45 +
                       fVar20 * fVar50 +
                       fVar18 * fVar46 +
                       fVar17 * fVar49 + fVar15 * fVar44 + fVar19 * fVar47 + fVar12 * fVar57;
                  fVar12 = *(float *)((long)pfVar78 + lVar76 + 0x20);
                  fVar13 = *(float *)((long)pfVar89 + lVar76 + 0x20);
                  fVar14 = *(float *)((long)pfVar78 + lVar76 + 0x1c);
                  fVar15 = *(float *)((long)pfVar89 + lVar76 + 0x1c);
                  fVar17 = *(float *)((long)pfVar84 + lVar76 + 0x1c);
                  fVar19 = *(float *)((long)pfVar84 + lVar76 + 0x20);
                  auVar94._0_4_ =
                       fVar18 * fVar33 + fVar16 * fVar58 + fVar20 * fVar36 + fVar14 * fVar54 +
                       fVar15 * fVar34 + fVar17 * fVar37 + *(float *)pauVar66[-1] +
                       fVar19 * fVar38 + fVar13 * fVar35 + fVar12 * fVar32;
                  auVar94._4_4_ =
                       fVar18 * fVar8 + fVar16 * fVar59 + fVar20 * fVar4 + fVar14 * fVar55 +
                       fVar15 * fVar5 + fVar17 * fVar6 + *(float *)(pauVar66[-1] + 4) +
                       fVar19 * fVar7 + fVar13 * fVar3 + fVar12 * fVar39;
                  auVar94._8_4_ =
                       fVar18 * fVar40 + fVar16 * fVar60 + fVar20 * fVar9 + fVar14 * fVar56 +
                       fVar15 * fVar43 + fVar17 * fVar11 + *(float *)(pauVar66[-1] + 8) +
                       fVar19 * fVar10 + fVar13 * fVar42 + fVar12 * fVar41;
                  auVar94._12_4_ =
                       fVar18 * fVar44 + fVar16 * fVar61 + fVar20 * fVar47 + fVar14 * fVar57 +
                       fVar15 * fVar48 + fVar17 * fVar49 + *(float *)(pauVar66[-1] + 0xc) +
                       fVar19 * fVar50 + fVar13 * fVar46 + fVar12 * fVar45;
                  pauVar66[-1] = auVar94;
                  uVar69 = uVar68 + 4;
                  iVar82 = uVar68 + 7;
                  lVar76 = lVar76 + 0x20;
                  uVar68 = uVar69;
                } while (iVar82 < (int)uVar29);
                pauVar77 = pauVar79 + 4;
                pfVar84 = (float *)((long)pfVar84 + lVar76);
                pfVar89 = (float *)((long)pfVar89 + lVar76);
                pfVar78 = (float *)((long)pfVar78 + lVar76);
              }
              if ((int)(uVar69 | 1) < (int)uVar29) {
                lVar76 = 0;
                pauVar66 = pauVar77;
                uVar68 = uVar69;
                do {
                  pauVar79 = pauVar66;
                  fVar12 = *(float *)((long)pfVar78 + lVar76);
                  fVar13 = *(float *)((long)pfVar78 + lVar76 + 4);
                  fVar14 = *(float *)((long)pfVar78 + lVar76 + 8);
                  fVar15 = *(float *)((long)pfVar89 + lVar76);
                  fVar16 = *(float *)((long)pfVar89 + lVar76 + 4);
                  fVar17 = *(float *)((long)pfVar89 + lVar76 + 8);
                  fVar18 = *(float *)((long)pfVar84 + lVar76);
                  pauVar66 = (undefined1 (*) [16])(pauVar77[2] + lVar76 * 2);
                  fVar51 = *(float *)(pauVar66[-2] + 4);
                  fVar52 = *(float *)(pauVar66[-2] + 8);
                  fVar53 = *(float *)(pauVar66[-2] + 0xc);
                  fVar19 = *(float *)((long)pfVar84 + lVar76 + 4);
                  fVar20 = *(float *)((long)pfVar84 + lVar76 + 8);
                  *(float *)pauVar66[-2] =
                       fVar13 * fVar54 + fVar14 * fVar32 + fVar15 * fVar33 + fVar17 * fVar35 +
                       fVar19 * fVar37 +
                       fVar20 * fVar38 +
                       fVar18 * fVar36 + fVar16 * fVar34 + fVar58 * fVar12 + *(float *)pauVar66[-2];
                  *(float *)(pauVar66[-2] + 4) =
                       fVar13 * fVar55 + fVar14 * fVar39 + fVar15 * fVar8 + fVar17 * fVar3 +
                       fVar19 * fVar6 +
                       fVar20 * fVar7 + fVar18 * fVar4 + fVar16 * fVar5 + fVar59 * fVar12 + fVar51;
                  *(float *)(pauVar66[-2] + 8) =
                       fVar13 * fVar56 + fVar14 * fVar41 + fVar15 * fVar40 + fVar17 * fVar42 +
                       fVar19 * fVar11 +
                       fVar20 * fVar10 + fVar18 * fVar9 + fVar16 * fVar43 + fVar60 * fVar12 + fVar52
                  ;
                  *(float *)(pauVar66[-2] + 0xc) =
                       fVar13 * fVar57 + fVar14 * fVar45 + fVar15 * fVar44 + fVar17 * fVar46 +
                       fVar19 * fVar49 +
                       fVar20 * fVar50 +
                       fVar18 * fVar47 + fVar16 * fVar48 + fVar61 * fVar12 + fVar53;
                  fVar12 = *(float *)((long)pfVar78 + lVar76 + 0x10);
                  fVar13 = *(float *)((long)pfVar89 + lVar76 + 0x10);
                  fVar15 = *(float *)((long)pfVar78 + lVar76 + 0xc);
                  fVar16 = *(float *)((long)pfVar89 + lVar76 + 0xc);
                  fVar18 = *(float *)((long)pfVar84 + lVar76 + 0xc);
                  fVar19 = *(float *)((long)pfVar84 + lVar76 + 0x10);
                  auVar95._0_4_ =
                       fVar17 * fVar33 + fVar14 * fVar58 + *(float *)pauVar66[-1] +
                       fVar20 * fVar36 + fVar15 * fVar54 + fVar16 * fVar34 + fVar18 * fVar37 +
                       fVar19 * fVar38 + fVar13 * fVar35 + fVar12 * fVar32;
                  auVar95._4_4_ =
                       fVar17 * fVar8 + fVar14 * fVar59 + *(float *)(pauVar66[-1] + 4) +
                       fVar20 * fVar4 + fVar15 * fVar55 + fVar16 * fVar5 + fVar18 * fVar6 +
                       fVar19 * fVar7 + fVar13 * fVar3 + fVar12 * fVar39;
                  auVar95._8_4_ =
                       fVar17 * fVar40 + fVar14 * fVar60 + *(float *)(pauVar66[-1] + 8) +
                       fVar20 * fVar9 + fVar15 * fVar56 + fVar16 * fVar43 + fVar18 * fVar11 +
                       fVar19 * fVar10 + fVar13 * fVar42 + fVar12 * fVar41;
                  auVar95._12_4_ =
                       fVar17 * fVar44 + fVar14 * fVar61 + *(float *)(pauVar66[-1] + 0xc) +
                       fVar20 * fVar47 + fVar15 * fVar57 + fVar16 * fVar48 + fVar18 * fVar49 +
                       fVar19 * fVar50 + fVar13 * fVar46 + fVar12 * fVar45;
                  pauVar66[-1] = auVar95;
                  uVar69 = uVar68 + 2;
                  iVar82 = uVar68 + 3;
                  lVar76 = lVar76 + 0x10;
                  uVar68 = uVar69;
                } while (iVar82 < (int)uVar29);
                pauVar77 = pauVar79 + 2;
                pfVar84 = (float *)((long)pfVar84 + lVar76);
                pfVar89 = (float *)((long)pfVar89 + lVar76);
                pfVar78 = (float *)((long)pfVar78 + lVar76);
              }
              if ((int)uVar69 < (int)uVar29) {
                lVar76 = 0;
                lVar74 = 0;
                do {
                  fVar12 = pfVar78[lVar74 * 2];
                  fVar13 = pfVar78[lVar74 * 2 + 1];
                  fVar14 = pfVar78[lVar74 * 2 + 2];
                  fVar15 = pfVar89[lVar74 * 2];
                  fVar16 = pfVar89[lVar74 * 2 + 1];
                  fVar17 = pfVar89[lVar74 * 2 + 2];
                  fVar18 = pfVar84[lVar74 * 2];
                  fVar19 = pfVar84[lVar74 * 2 + 1];
                  fVar20 = pfVar84[lVar74 * 2 + 2];
                  auVar96._0_4_ =
                       fVar13 * fVar54 + fVar14 * fVar32 + fVar15 * fVar33 + fVar17 * fVar35 +
                       fVar19 * fVar37 +
                       fVar20 * fVar38 +
                       fVar18 * fVar36 + fVar16 * fVar34 + fVar58 * fVar12 + *(float *)*pauVar77;
                  auVar96._4_4_ =
                       fVar13 * fVar55 + fVar14 * fVar39 + fVar15 * fVar8 + fVar17 * fVar3 +
                       fVar19 * fVar6 +
                       fVar20 * fVar7 +
                       fVar18 * fVar4 +
                       fVar16 * fVar5 + fVar59 * fVar12 + *(float *)((long)*pauVar77 + 4);
                  auVar96._8_4_ =
                       fVar13 * fVar56 + fVar14 * fVar41 + fVar15 * fVar40 + fVar17 * fVar42 +
                       fVar19 * fVar11 +
                       fVar20 * fVar10 +
                       fVar18 * fVar9 +
                       fVar16 * fVar43 + fVar60 * fVar12 + *(float *)((long)*pauVar77 + 8);
                  auVar96._12_4_ =
                       fVar13 * fVar57 + fVar14 * fVar45 + fVar15 * fVar44 + fVar17 * fVar46 +
                       fVar19 * fVar49 +
                       fVar20 * fVar50 +
                       fVar18 * fVar47 +
                       fVar16 * fVar48 + fVar61 * fVar12 + *(float *)((long)*pauVar77 + 0xc);
                  *pauVar77 = auVar96;
                  pauVar77 = pauVar77 + 1;
                  lVar74 = lVar74 + 1;
                  lVar76 = lVar76 + -8;
                } while (uVar29 - uVar69 != (int)lVar74);
                pfVar84 = (float *)((long)pfVar84 - lVar76);
                pfVar89 = (float *)((long)pfVar89 - lVar76);
                pfVar78 = (float *)((long)pfVar78 - lVar76);
              }
              pfVar78 = pfVar78 + lVar91;
              pfVar89 = pfVar89 + lVar91;
              pfVar84 = pfVar84 + lVar91;
              iVar67 = iVar67 + 1;
            } while (iVar67 != iVar30);
          }
          pfVar86 = pfVar86 + 0x24;
          uVar87 = uVar87 + 1;
        } while (uVar87 != uVar28);
      }
      uVar81 = uVar81 + 1;
    } while ((long)uVar81 < (long)iVar31);
  }
  return;
}

Assistant:

static void conv3x3s2_pack1to4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;
    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int tailstep = w - 2 * outw + w;

    const float* bias = _bias;
    int nn_outch = outch >> 1;
    int remain_outch_start = nn_outch << 1;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 2;

        Mat out0 = top_blob.channel(p);
        Mat out1 = top_blob.channel(p + 1);

        __m128 _bias0 = bias ? _mm_loadu_ps((const float*)bias + p * 4) : _mm_set1_ps(0.f);
        __m128 _bias1 = bias ? _mm_loadu_ps((const float*)bias + (p + 1) * 4) : _mm_set1_ps(0.f);
        out0.fill(_bias0);
        out1.fill(_bias1);

        const float* k0 = kernel.channel(p);
        const float* k1 = kernel.channel(p + 1);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0;
            float* outptr1 = out1;

            const Mat img0 = bottom_blob.channel(q);

            const float* r0 = img0.row(0);
            const float* r1 = img0.row(1);
            const float* r2 = img0.row(2);

            __m128 _k00_0 = _mm_loadu_ps(k0);
            __m128 _k01_0 = _mm_loadu_ps(k0 + 4);
            __m128 _k02_0 = _mm_loadu_ps(k0 + 8);
            __m128 _k10_0 = _mm_loadu_ps(k0 + 12);
            __m128 _k11_0 = _mm_loadu_ps(k0 + 16);
            __m128 _k12_0 = _mm_loadu_ps(k0 + 20);
            __m128 _k20_0 = _mm_loadu_ps(k0 + 24);
            __m128 _k21_0 = _mm_loadu_ps(k0 + 28);
            __m128 _k22_0 = _mm_loadu_ps(k0 + 32);

            __m128 _k00_1 = _mm_loadu_ps(k1);
            __m128 _k01_1 = _mm_loadu_ps(k1 + 4);
            __m128 _k02_1 = _mm_loadu_ps(k1 + 8);
            __m128 _k10_1 = _mm_loadu_ps(k1 + 12);
            __m128 _k11_1 = _mm_loadu_ps(k1 + 16);
            __m128 _k12_1 = _mm_loadu_ps(k1 + 20);
            __m128 _k20_1 = _mm_loadu_ps(k1 + 24);
            __m128 _k21_1 = _mm_loadu_ps(k1 + 28);
            __m128 _k22_1 = _mm_loadu_ps(k1 + 32);

            int i = 0;

            for (; i < outh; i++)
            {
                int j = 0;

                for (; j + 3 < outw; j += 4)
                {
                    __m128 _sum00 = _mm_loadu_ps(outptr0);
                    __m128 _sum10 = _mm_loadu_ps(outptr1);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum00 = _mm_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _sum10 = _mm_comp_fmadd_ps(_r01, _k00_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r02, _k01_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r03, _k02_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r11, _k10_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r12, _k11_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r13, _k12_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r21, _k20_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r22, _k21_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r23, _k22_1, _sum10);

                    _mm_storeu_ps(outptr0, _sum00);
                    _mm_storeu_ps(outptr1, _sum10);

                    __m128 _sum01 = _mm_loadu_ps(outptr0 + 4);
                    __m128 _sum11 = _mm_loadu_ps(outptr1 + 4);

                    __m128 _r04 = _mm_set1_ps(*(r0 + 3));
                    __m128 _r14 = _mm_set1_ps(*(r1 + 3));
                    __m128 _r24 = _mm_set1_ps(*(r2 + 3));
                    __m128 _r05 = _mm_set1_ps(*(r0 + 4));
                    __m128 _r15 = _mm_set1_ps(*(r1 + 4));
                    __m128 _r25 = _mm_set1_ps(*(r2 + 4));

                    _sum01 = _mm_comp_fmadd_ps(_r03, _k00_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r04, _k01_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r05, _k02_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r13, _k10_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r14, _k11_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r15, _k12_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r23, _k20_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r24, _k21_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r25, _k22_0, _sum01);

                    _sum11 = _mm_comp_fmadd_ps(_r03, _k00_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r04, _k01_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r05, _k02_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r13, _k10_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r14, _k11_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r15, _k12_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r23, _k20_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r24, _k21_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r25, _k22_1, _sum11);

                    _mm_storeu_ps(outptr0 + 4, _sum01);
                    _mm_storeu_ps(outptr1 + 4, _sum11);

                    __m128 _sum02 = _mm_loadu_ps(outptr0 + 8);
                    __m128 _sum12 = _mm_loadu_ps(outptr1 + 8);

                    __m128 _r06 = _mm_set1_ps(*(r0 + 5));
                    __m128 _r16 = _mm_set1_ps(*(r1 + 5));
                    __m128 _r26 = _mm_set1_ps(*(r2 + 5));
                    __m128 _r07 = _mm_set1_ps(*(r0 + 6));
                    __m128 _r17 = _mm_set1_ps(*(r1 + 6));
                    __m128 _r27 = _mm_set1_ps(*(r2 + 6));

                    _sum02 = _mm_comp_fmadd_ps(_r05, _k00_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r06, _k01_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r07, _k02_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r15, _k10_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r16, _k11_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r17, _k12_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r25, _k20_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r26, _k21_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r27, _k22_0, _sum02);

                    _sum12 = _mm_comp_fmadd_ps(_r05, _k00_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r06, _k01_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r07, _k02_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r15, _k10_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r16, _k11_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r17, _k12_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r25, _k20_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r26, _k21_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r27, _k22_1, _sum12);

                    _mm_storeu_ps(outptr0 + 8, _sum02);
                    _mm_storeu_ps(outptr1 + 8, _sum12);

                    __m128 _r08 = _mm_set1_ps(*(r0 + 7));
                    __m128 _r18 = _mm_set1_ps(*(r1 + 7));
                    __m128 _r28 = _mm_set1_ps(*(r2 + 7));
                    __m128 _r09 = _mm_set1_ps(*(r0 + 8));
                    __m128 _r19 = _mm_set1_ps(*(r1 + 8));
                    __m128 _r29 = _mm_set1_ps(*(r2 + 8));

                    __m128 _sum03 = _mm_loadu_ps(outptr0 + 12);
                    __m128 _sum13 = _mm_loadu_ps(outptr1 + 12);

                    _sum03 = _mm_comp_fmadd_ps(_r07, _k00_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r08, _k01_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r09, _k02_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r17, _k10_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r18, _k11_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r19, _k12_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r27, _k20_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r28, _k21_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r29, _k22_0, _sum03);

                    _sum13 = _mm_comp_fmadd_ps(_r07, _k00_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r08, _k01_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r09, _k02_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r17, _k10_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r18, _k11_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r19, _k12_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r27, _k20_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r28, _k21_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r29, _k22_1, _sum13);

                    _mm_storeu_ps(outptr0 + 12, _sum03);
                    _mm_storeu_ps(outptr1 + 12, _sum13);
                    r0 += 8;
                    r1 += 8;
                    r2 += 8;
                    outptr0 += 16;
                    outptr1 += 16;
                }

                for (; j + 1 < outw; j += 2)
                {
                    __m128 _sum00 = _mm_loadu_ps(outptr0);
                    __m128 _sum10 = _mm_loadu_ps(outptr1);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum00 = _mm_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _sum10 = _mm_comp_fmadd_ps(_r01, _k00_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r02, _k01_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r03, _k02_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r11, _k10_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r12, _k11_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r13, _k12_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r21, _k20_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r22, _k21_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r23, _k22_1, _sum10);

                    _mm_storeu_ps(outptr0, _sum00);
                    _mm_storeu_ps(outptr1, _sum10);

                    __m128 _sum01 = _mm_loadu_ps(outptr0 + 4);
                    __m128 _sum11 = _mm_loadu_ps(outptr1 + 4);

                    __m128 _r04 = _mm_set1_ps(*(r0 + 3));
                    __m128 _r14 = _mm_set1_ps(*(r1 + 3));
                    __m128 _r24 = _mm_set1_ps(*(r2 + 3));
                    __m128 _r05 = _mm_set1_ps(*(r0 + 4));
                    __m128 _r15 = _mm_set1_ps(*(r1 + 4));
                    __m128 _r25 = _mm_set1_ps(*(r2 + 4));

                    _sum01 = _mm_comp_fmadd_ps(_r03, _k00_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r04, _k01_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r05, _k02_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r13, _k10_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r14, _k11_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r15, _k12_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r23, _k20_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r24, _k21_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r25, _k22_0, _sum01);

                    _sum11 = _mm_comp_fmadd_ps(_r03, _k00_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r04, _k01_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r05, _k02_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r13, _k10_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r14, _k11_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r15, _k12_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r23, _k20_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r24, _k21_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r25, _k22_1, _sum11);

                    _mm_storeu_ps(outptr0 + 4, _sum01);
                    _mm_storeu_ps(outptr1 + 4, _sum11);

                    r0 += 4;
                    r1 += 4;
                    r2 += 4;
                    outptr0 += 8;
                    outptr1 += 8;
                }
                for (; j < outw; j++)
                {
                    __m128 _sum00 = _mm_loadu_ps(outptr0);
                    __m128 _sum10 = _mm_loadu_ps(outptr1);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum00 = _mm_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _sum10 = _mm_comp_fmadd_ps(_r01, _k00_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r02, _k01_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r03, _k02_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r11, _k10_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r12, _k11_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r13, _k12_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r21, _k20_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r22, _k21_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r23, _k22_1, _sum10);

                    _mm_storeu_ps(outptr0, _sum00);
                    _mm_storeu_ps(outptr1, _sum10);

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    outptr0 += 4;
                    outptr1 += 4;
                }
                r0 += tailstep;
                r1 += tailstep;
                r2 += tailstep;
            }

            k0 += 9 * 4;
            k1 += 9 * 4;
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        Mat out0 = top_blob.channel(p);

        __m128 _bias0 = bias ? _mm_loadu_ps((const float*)bias + p * 4) : _mm_set1_ps(0.f);
        out0.fill(_bias0);

        const float* k0 = kernel.channel(p);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0.row(0);

            const Mat img0 = bottom_blob.channel(q);

            const float* r0 = img0.row(0);
            const float* r1 = img0.row(1);
            const float* r2 = img0.row(2);

            __m128 _k00_0 = _mm_loadu_ps(k0);
            __m128 _k01_0 = _mm_loadu_ps(k0 + 4);
            __m128 _k02_0 = _mm_loadu_ps(k0 + 8);
            __m128 _k10_0 = _mm_loadu_ps(k0 + 12);
            __m128 _k11_0 = _mm_loadu_ps(k0 + 16);
            __m128 _k12_0 = _mm_loadu_ps(k0 + 20);
            __m128 _k20_0 = _mm_loadu_ps(k0 + 24);
            __m128 _k21_0 = _mm_loadu_ps(k0 + 28);
            __m128 _k22_0 = _mm_loadu_ps(k0 + 32);

            int i = 0;

            for (; i < outh; i++)
            {
                int j = 0;
                for (; j + 7 < outw; j += 8)
                {
                    __m128 _sum00 = _mm_loadu_ps(outptr0);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum00 = _mm_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _mm_storeu_ps(outptr0, _sum00);

                    __m128 _sum01 = _mm_loadu_ps(outptr0 + 4);

                    __m128 _r04 = _mm_set1_ps(*(r0 + 3));
                    __m128 _r14 = _mm_set1_ps(*(r1 + 3));
                    __m128 _r24 = _mm_set1_ps(*(r2 + 3));
                    __m128 _r05 = _mm_set1_ps(*(r0 + 4));
                    __m128 _r15 = _mm_set1_ps(*(r1 + 4));
                    __m128 _r25 = _mm_set1_ps(*(r2 + 4));

                    _sum01 = _mm_comp_fmadd_ps(_r03, _k00_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r04, _k01_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r05, _k02_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r13, _k10_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r14, _k11_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r15, _k12_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r23, _k20_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r24, _k21_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r25, _k22_0, _sum01);

                    _mm_storeu_ps(outptr0 + 4, _sum01);

                    __m128 _sum02 = _mm_loadu_ps(outptr0 + 8);

                    __m128 _r06 = _mm_set1_ps(*(r0 + 5));
                    __m128 _r16 = _mm_set1_ps(*(r1 + 5));
                    __m128 _r26 = _mm_set1_ps(*(r2 + 5));
                    __m128 _r07 = _mm_set1_ps(*(r0 + 6));
                    __m128 _r17 = _mm_set1_ps(*(r1 + 6));
                    __m128 _r27 = _mm_set1_ps(*(r2 + 6));

                    _sum02 = _mm_comp_fmadd_ps(_r05, _k00_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r06, _k01_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r07, _k02_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r15, _k10_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r16, _k11_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r17, _k12_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r25, _k20_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r26, _k21_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r27, _k22_0, _sum02);

                    _mm_storeu_ps(outptr0 + 8, _sum02);

                    __m128 _r08 = _mm_set1_ps(*(r0 + 7));
                    __m128 _r18 = _mm_set1_ps(*(r1 + 7));
                    __m128 _r28 = _mm_set1_ps(*(r2 + 7));
                    __m128 _r09 = _mm_set1_ps(*(r0 + 8));
                    __m128 _r19 = _mm_set1_ps(*(r1 + 8));
                    __m128 _r29 = _mm_set1_ps(*(r2 + 8));

                    __m128 _sum03 = _mm_loadu_ps(outptr0 + 12);

                    _sum03 = _mm_comp_fmadd_ps(_r07, _k00_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r08, _k01_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r09, _k02_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r17, _k10_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r18, _k11_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r19, _k12_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r27, _k20_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r28, _k21_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r29, _k22_0, _sum03);

                    _mm_storeu_ps(outptr0 + 12, _sum03);

                    __m128 _r010 = _mm_set1_ps(*(r0 + 9));
                    __m128 _r110 = _mm_set1_ps(*(r1 + 9));
                    __m128 _r210 = _mm_set1_ps(*(r2 + 9));
                    __m128 _r011 = _mm_set1_ps(*(r0 + 10));
                    __m128 _r111 = _mm_set1_ps(*(r1 + 10));
                    __m128 _r211 = _mm_set1_ps(*(r2 + 10));

                    __m128 _sum04 = _mm_loadu_ps(outptr0 + 16);

                    _sum04 = _mm_comp_fmadd_ps(_r09, _k00_0, _sum04);
                    _sum04 = _mm_comp_fmadd_ps(_r010, _k01_0, _sum04);
                    _sum04 = _mm_comp_fmadd_ps(_r011, _k02_0, _sum04);
                    _sum04 = _mm_comp_fmadd_ps(_r19, _k10_0, _sum04);
                    _sum04 = _mm_comp_fmadd_ps(_r110, _k11_0, _sum04);
                    _sum04 = _mm_comp_fmadd_ps(_r111, _k12_0, _sum04);
                    _sum04 = _mm_comp_fmadd_ps(_r29, _k20_0, _sum04);
                    _sum04 = _mm_comp_fmadd_ps(_r210, _k21_0, _sum04);
                    _sum04 = _mm_comp_fmadd_ps(_r211, _k22_0, _sum04);

                    _mm_storeu_ps(outptr0 + 16, _sum04);

                    __m128 _r012 = _mm_set1_ps(*(r0 + 11));
                    __m128 _r112 = _mm_set1_ps(*(r1 + 11));
                    __m128 _r212 = _mm_set1_ps(*(r2 + 11));
                    __m128 _r013 = _mm_set1_ps(*(r0 + 12));
                    __m128 _r113 = _mm_set1_ps(*(r1 + 12));
                    __m128 _r213 = _mm_set1_ps(*(r2 + 12));

                    __m128 _sum05 = _mm_loadu_ps(outptr0 + 20);

                    _sum05 = _mm_comp_fmadd_ps(_r011, _k00_0, _sum05);
                    _sum05 = _mm_comp_fmadd_ps(_r012, _k01_0, _sum05);
                    _sum05 = _mm_comp_fmadd_ps(_r013, _k02_0, _sum05);
                    _sum05 = _mm_comp_fmadd_ps(_r111, _k10_0, _sum05);
                    _sum05 = _mm_comp_fmadd_ps(_r112, _k11_0, _sum05);
                    _sum05 = _mm_comp_fmadd_ps(_r113, _k12_0, _sum05);
                    _sum05 = _mm_comp_fmadd_ps(_r211, _k20_0, _sum05);
                    _sum05 = _mm_comp_fmadd_ps(_r212, _k21_0, _sum05);
                    _sum05 = _mm_comp_fmadd_ps(_r213, _k22_0, _sum05);

                    _mm_storeu_ps(outptr0 + 20, _sum05);

                    __m128 _r014 = _mm_set1_ps(*(r0 + 13));
                    __m128 _r114 = _mm_set1_ps(*(r1 + 13));
                    __m128 _r214 = _mm_set1_ps(*(r2 + 13));
                    __m128 _r015 = _mm_set1_ps(*(r0 + 14));
                    __m128 _r115 = _mm_set1_ps(*(r1 + 14));
                    __m128 _r215 = _mm_set1_ps(*(r2 + 14));

                    __m128 _sum06 = _mm_loadu_ps(outptr0 + 24);

                    _sum06 = _mm_comp_fmadd_ps(_r013, _k00_0, _sum06);
                    _sum06 = _mm_comp_fmadd_ps(_r014, _k01_0, _sum06);
                    _sum06 = _mm_comp_fmadd_ps(_r015, _k02_0, _sum06);
                    _sum06 = _mm_comp_fmadd_ps(_r113, _k10_0, _sum06);
                    _sum06 = _mm_comp_fmadd_ps(_r114, _k11_0, _sum06);
                    _sum06 = _mm_comp_fmadd_ps(_r115, _k12_0, _sum06);
                    _sum06 = _mm_comp_fmadd_ps(_r213, _k20_0, _sum06);
                    _sum06 = _mm_comp_fmadd_ps(_r214, _k21_0, _sum06);
                    _sum06 = _mm_comp_fmadd_ps(_r215, _k22_0, _sum06);

                    _mm_storeu_ps(outptr0 + 24, _sum06);

                    __m128 _r016 = _mm_set1_ps(*(r0 + 15));
                    __m128 _r116 = _mm_set1_ps(*(r1 + 15));
                    __m128 _r216 = _mm_set1_ps(*(r2 + 15));
                    __m128 _r017 = _mm_set1_ps(*(r0 + 16));
                    __m128 _r117 = _mm_set1_ps(*(r1 + 16));
                    __m128 _r217 = _mm_set1_ps(*(r2 + 16));

                    __m128 _sum07 = _mm_loadu_ps(outptr0 + 28);

                    _sum07 = _mm_comp_fmadd_ps(_r015, _k00_0, _sum07);
                    _sum07 = _mm_comp_fmadd_ps(_r016, _k01_0, _sum07);
                    _sum07 = _mm_comp_fmadd_ps(_r017, _k02_0, _sum07);
                    _sum07 = _mm_comp_fmadd_ps(_r115, _k10_0, _sum07);
                    _sum07 = _mm_comp_fmadd_ps(_r116, _k11_0, _sum07);
                    _sum07 = _mm_comp_fmadd_ps(_r117, _k12_0, _sum07);
                    _sum07 = _mm_comp_fmadd_ps(_r215, _k20_0, _sum07);
                    _sum07 = _mm_comp_fmadd_ps(_r216, _k21_0, _sum07);
                    _sum07 = _mm_comp_fmadd_ps(_r217, _k22_0, _sum07);

                    _mm_storeu_ps(outptr0 + 28, _sum07);

                    r0 += 16;
                    r1 += 16;
                    r2 += 16;
                    outptr0 += 32;
                }

                for (; j + 3 < outw; j += 4)
                {
                    __m128 _sum00 = _mm_loadu_ps(outptr0);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum00 = _mm_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _mm_storeu_ps(outptr0, _sum00);

                    __m128 _sum01 = _mm_loadu_ps(outptr0 + 4);

                    __m128 _r04 = _mm_set1_ps(*(r0 + 3));
                    __m128 _r14 = _mm_set1_ps(*(r1 + 3));
                    __m128 _r24 = _mm_set1_ps(*(r2 + 3));
                    __m128 _r05 = _mm_set1_ps(*(r0 + 4));
                    __m128 _r15 = _mm_set1_ps(*(r1 + 4));
                    __m128 _r25 = _mm_set1_ps(*(r2 + 4));

                    _sum01 = _mm_comp_fmadd_ps(_r03, _k00_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r04, _k01_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r05, _k02_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r13, _k10_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r14, _k11_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r15, _k12_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r23, _k20_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r24, _k21_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r25, _k22_0, _sum01);

                    _mm_storeu_ps(outptr0 + 4, _sum01);

                    __m128 _sum02 = _mm_loadu_ps(outptr0 + 8);

                    __m128 _r06 = _mm_set1_ps(*(r0 + 5));
                    __m128 _r16 = _mm_set1_ps(*(r1 + 5));
                    __m128 _r26 = _mm_set1_ps(*(r2 + 5));
                    __m128 _r07 = _mm_set1_ps(*(r0 + 6));
                    __m128 _r17 = _mm_set1_ps(*(r1 + 6));
                    __m128 _r27 = _mm_set1_ps(*(r2 + 6));

                    _sum02 = _mm_comp_fmadd_ps(_r05, _k00_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r06, _k01_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r07, _k02_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r15, _k10_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r16, _k11_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r17, _k12_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r25, _k20_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r26, _k21_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r27, _k22_0, _sum02);

                    _mm_storeu_ps(outptr0 + 8, _sum02);

                    __m128 _r08 = _mm_set1_ps(*(r0 + 7));
                    __m128 _r18 = _mm_set1_ps(*(r1 + 7));
                    __m128 _r28 = _mm_set1_ps(*(r2 + 7));
                    __m128 _r09 = _mm_set1_ps(*(r0 + 8));
                    __m128 _r19 = _mm_set1_ps(*(r1 + 8));
                    __m128 _r29 = _mm_set1_ps(*(r2 + 8));

                    __m128 _sum03 = _mm_loadu_ps(outptr0 + 12);

                    _sum03 = _mm_comp_fmadd_ps(_r07, _k00_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r08, _k01_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r09, _k02_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r17, _k10_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r18, _k11_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r19, _k12_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r27, _k20_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r28, _k21_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r29, _k22_0, _sum03);

                    _mm_storeu_ps(outptr0 + 12, _sum03);
                    r0 += 8;
                    r1 += 8;
                    r2 += 8;
                    outptr0 += 16;
                }

                for (; j + 1 < outw; j += 2)
                {
                    __m128 _sum00 = _mm_loadu_ps(outptr0);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum00 = _mm_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _mm_storeu_ps(outptr0, _sum00);

                    __m128 _sum01 = _mm_loadu_ps(outptr0 + 4);

                    __m128 _r04 = _mm_set1_ps(*(r0 + 3));
                    __m128 _r14 = _mm_set1_ps(*(r1 + 3));
                    __m128 _r24 = _mm_set1_ps(*(r2 + 3));
                    __m128 _r05 = _mm_set1_ps(*(r0 + 4));
                    __m128 _r15 = _mm_set1_ps(*(r1 + 4));
                    __m128 _r25 = _mm_set1_ps(*(r2 + 4));

                    _sum01 = _mm_comp_fmadd_ps(_r03, _k00_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r04, _k01_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r05, _k02_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r13, _k10_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r14, _k11_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r15, _k12_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r23, _k20_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r24, _k21_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r25, _k22_0, _sum01);

                    _mm_storeu_ps(outptr0 + 4, _sum01);

                    r0 += 4;
                    r1 += 4;
                    r2 += 4;
                    outptr0 += 8;
                }
                for (; j < outw; j++)
                {
                    __m128 _sum00 = _mm_loadu_ps(outptr0);
                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum00 = _mm_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r23, _k22_0, _sum00);
                    _mm_storeu_ps(outptr0, _sum00);

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    outptr0 += 4;
                }
                r0 += tailstep;
                r1 += tailstep;
                r2 += tailstep;
            }

            k0 += 9 * 4;
        }
    }
}